

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

void binarySearch4(uint16_t *array,int32_t n,uint16_t target1,uint16_t target2,uint16_t target3,
                  uint16_t target4,int32_t *index1,int32_t *index2,int32_t *index3,int32_t *index4)

{
  int iVar1;
  uint16_t *local_70;
  uint16_t *local_68;
  uint16_t *local_60;
  uint16_t *local_58;
  int32_t half;
  uint16_t *base4;
  uint16_t *base3;
  uint16_t *base2;
  uint16_t *base1;
  uint16_t target4_local;
  uint16_t target3_local;
  uint16_t target2_local;
  uint16_t target1_local;
  int32_t n_local;
  uint16_t *array_local;
  
  base4 = array;
  base3 = array;
  base2 = array;
  base1 = array;
  n_local = n;
  if (n != 0) {
    for (; 1 < n_local; n_local = n_local - iVar1) {
      iVar1 = n_local >> 1;
      if (base1[iVar1] < target1) {
        local_58 = base1 + iVar1;
      }
      else {
        local_58 = base1;
      }
      base1 = local_58;
      if (base2[iVar1] < target2) {
        local_60 = base2 + iVar1;
      }
      else {
        local_60 = base2;
      }
      base2 = local_60;
      if (base3[iVar1] < target3) {
        local_68 = base3 + iVar1;
      }
      else {
        local_68 = base3;
      }
      base3 = local_68;
      if (base4[iVar1] < target4) {
        local_70 = base4 + iVar1;
      }
      else {
        local_70 = base4;
      }
      base4 = local_70;
    }
    *index1 = (int32_t)((long)base1 + ((long)(int)(uint)(*base1 < target1) * 2 - (long)array) >> 1);
    *index2 = (int32_t)((long)base2 + ((long)(int)(uint)(*base2 < target2) * 2 - (long)array) >> 1);
    *index3 = (int32_t)((long)base3 + ((long)(int)(uint)(*base3 < target3) * 2 - (long)array) >> 1);
    *index4 = (int32_t)((long)base4 + ((long)(int)(uint)(*base4 < target4) * 2 - (long)array) >> 1);
  }
  return;
}

Assistant:

static void binarySearch4(const uint16_t *array, int32_t n, uint16_t target1,
                          uint16_t target2, uint16_t target3, uint16_t target4,
                          int32_t *index1, int32_t *index2, int32_t *index3,
                          int32_t *index4) {
    const uint16_t *base1 = array;
    const uint16_t *base2 = array;
    const uint16_t *base3 = array;
    const uint16_t *base4 = array;
    if (n == 0) return;
    while (n > 1) {
        int32_t half = n >> 1;
        base1 = (base1[half] < target1) ? &base1[half] : base1;
        base2 = (base2[half] < target2) ? &base2[half] : base2;
        base3 = (base3[half] < target3) ? &base3[half] : base3;
        base4 = (base4[half] < target4) ? &base4[half] : base4;
        n -= half;
    }
    *index1 = (int32_t)((*base1 < target1) + base1 - array);
    *index2 = (int32_t)((*base2 < target2) + base2 - array);
    *index3 = (int32_t)((*base3 < target3) + base3 - array);
    *index4 = (int32_t)((*base4 < target4) + base4 - array);
}